

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QRenderRule::setClip(QRenderRule *this,QPainter *p,QRect *rect)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  char cVar5;
  long in_FS_OFFSET;
  QRect r;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->clipset;
  this->clipset = iVar1 + 1;
  if (iVar1 == 0) {
    uVar2 = rect->x1;
    uVar4 = rect->y1;
    r.y2.m_i = uVar4;
    r.x2.m_i = uVar2;
    r._0_8_ = this;
    borderClip((QRenderRule *)&stack0xffffffffffffffd0,r);
    uVar3 = *(undefined8 *)&this->clipPath;
    *(undefined8 *)&this->clipPath = local_30;
    local_30 = uVar3;
    QPainterPath::~QPainterPath((QPainterPath *)&stack0xffffffffffffffd0);
    cVar5 = QPainterPath::isEmpty();
    if (cVar5 == '\0') {
      QPainter::save();
      QPainter::setClipPath((QPainterPath *)p,(int)this + 0x80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRenderRule::setClip(QPainter *p, const QRect &rect)
{
    if (clipset++)
        return;
    clipPath = borderClip(rect);
    if (!clipPath.isEmpty()) {
        p->save();
        p->setClipPath(clipPath, Qt::IntersectClip);
    }
}